

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O0

void P_ForwardThrust(player_t *player,DAngle *angle,double move)

{
  AActor *this;
  uint uVar1;
  double dVar2;
  bool local_41;
  TAngle<double> local_38;
  double local_30;
  double zpush;
  double local_20;
  double move_local;
  DAngle *angle_local;
  player_t *player_local;
  
  local_20 = move;
  move_local = (double)angle;
  angle_local = (DAngle *)player;
  if ((player->mo->super_AActor).waterlevel == 0) {
    TFlags<ActorFlag,_unsigned_int>::operator&
              ((TFlags<ActorFlag,_unsigned_int> *)((long)&zpush + 4),
               (int)player->mo +
               (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE));
    uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&zpush + 4));
    local_41 = false;
    if (uVar1 == 0) goto LAB_0061f0b3;
  }
  local_41 = TAngle<double>::operator!=((TAngle<double> *)((long)angle_local->Degrees + 0xa8),0.0);
LAB_0061f0b3:
  dVar2 = local_20;
  if (local_41 != false) {
    local_30 = TAngle<double>::Sin((TAngle<double> *)((long)angle_local->Degrees + 0xa8));
    local_30 = dVar2 * local_30;
    if (((*(int *)((long)angle_local->Degrees + 0x2d0) != 0) &&
        (*(int *)((long)angle_local->Degrees + 0x2d0) < 2)) && (local_30 < 0.0)) {
      local_30 = 0.0;
    }
    *(double *)((long)angle_local->Degrees + 0xd8) =
         *(double *)((long)angle_local->Degrees + 0xd8) - local_30;
    dVar2 = TAngle<double>::Cos((TAngle<double> *)((long)angle_local->Degrees + 0xa8));
    local_20 = dVar2 * local_20;
  }
  this = (AActor *)angle_local->Degrees;
  TAngle<double>::TAngle(&local_38,angle);
  AActor::Thrust(this,&local_38,local_20);
  return;
}

Assistant:

void P_ForwardThrust (player_t *player, DAngle angle, double move)
{
	if ((player->mo->waterlevel || (player->mo->flags & MF_NOGRAVITY))
		&& player->mo->Angles.Pitch != 0)
	{
		double zpush = move * player->mo->Angles.Pitch.Sin();
		if (player->mo->waterlevel && player->mo->waterlevel < 2 && zpush < 0)
			zpush = 0;
		player->mo->Vel.Z -= zpush;
		move *= player->mo->Angles.Pitch.Cos();
	}
	player->mo->Thrust(angle, move);
}